

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

int gladLoadGLLoader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  bool local_19;
  GLADloadproc load_local;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      find_coreGL();
      load_GL_VERSION_1_0(load);
      load_GL_VERSION_1_1(load);
      load_GL_VERSION_1_2(load);
      load_GL_VERSION_1_3(load);
      load_GL_VERSION_1_4(load);
      load_GL_VERSION_1_5(load);
      load_GL_VERSION_2_0(load);
      load_GL_VERSION_2_1(load);
      load_GL_VERSION_3_0(load);
      load_GL_VERSION_3_1(load);
      load_GL_VERSION_3_2(load);
      load_GL_VERSION_3_3(load);
      iVar1 = find_extensionsGL();
      if (iVar1 == 0) {
        load_local._4_4_ = 0;
      }
      else {
        load_GL_AMD_debug_output(load);
        load_GL_ARB_ES2_compatibility(load);
        load_GL_ARB_buffer_storage(load);
        load_GL_ARB_debug_output(load);
        load_GL_ARB_draw_buffers(load);
        load_GL_ARB_draw_buffers_blend(load);
        load_GL_ARB_fragment_program(load);
        load_GL_ARB_framebuffer_object(load);
        load_GL_ARB_multisample(load);
        load_GL_ARB_sample_locations(load);
        load_GL_ARB_texture_compression(load);
        load_GL_ARB_texture_multisample(load);
        load_GL_ARB_uniform_buffer_object(load);
        load_GL_ARB_vertex_array_object(load);
        load_GL_ARB_vertex_attrib_binding(load);
        load_GL_ARB_vertex_buffer_object(load);
        load_GL_ARB_vertex_program(load);
        load_GL_ARB_vertex_shader(load);
        load_GL_ATI_element_array(load);
        load_GL_ATI_fragment_shader(load);
        load_GL_ATI_vertex_array_object(load);
        load_GL_EXT_blend_color(load);
        load_GL_EXT_blend_equation_separate(load);
        load_GL_EXT_blend_func_separate(load);
        load_GL_EXT_debug_marker(load);
        load_GL_EXT_framebuffer_blit(load);
        load_GL_EXT_framebuffer_multisample(load);
        load_GL_EXT_framebuffer_object(load);
        load_GL_EXT_vertex_array(load);
        load_GL_EXT_vertex_shader(load);
        local_19 = GLVersion.major != 0 || GLVersion.minor != 0;
        load_local._4_4_ = (uint)local_19;
      }
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);

	if (!find_extensionsGL()) return 0;
	load_GL_AMD_debug_output(load);
	load_GL_ARB_ES2_compatibility(load);
	load_GL_ARB_buffer_storage(load);
	load_GL_ARB_debug_output(load);
	load_GL_ARB_draw_buffers(load);
	load_GL_ARB_draw_buffers_blend(load);
	load_GL_ARB_fragment_program(load);
	load_GL_ARB_framebuffer_object(load);
	load_GL_ARB_multisample(load);
	load_GL_ARB_sample_locations(load);
	load_GL_ARB_texture_compression(load);
	load_GL_ARB_texture_multisample(load);
	load_GL_ARB_uniform_buffer_object(load);
	load_GL_ARB_vertex_array_object(load);
	load_GL_ARB_vertex_attrib_binding(load);
	load_GL_ARB_vertex_buffer_object(load);
	load_GL_ARB_vertex_program(load);
	load_GL_ARB_vertex_shader(load);
	load_GL_ATI_element_array(load);
	load_GL_ATI_fragment_shader(load);
	load_GL_ATI_vertex_array_object(load);
	load_GL_EXT_blend_color(load);
	load_GL_EXT_blend_equation_separate(load);
	load_GL_EXT_blend_func_separate(load);
	load_GL_EXT_debug_marker(load);
	load_GL_EXT_framebuffer_blit(load);
	load_GL_EXT_framebuffer_multisample(load);
	load_GL_EXT_framebuffer_object(load);
	load_GL_EXT_vertex_array(load);
	load_GL_EXT_vertex_shader(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}